

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rastack.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::RAStackAllocator::calculateStackFrame(RAStackAllocator *this)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  Error EVar4;
  ulong uVar5;
  long in_RDI;
  Error _err;
  uint32_t slotSize_1;
  uint32_t index_1;
  uint32_t gapEnd;
  RAStackGap gap;
  uint32_t index;
  uint32_t slotSize;
  uint32_t gapOffset;
  uint32_t gapSize;
  bool foundGap;
  uint32_t alignedOffset;
  uint32_t slotAlignment;
  RAStackSlot *slot_1;
  iterator __end2_1;
  iterator __begin2_1;
  RAStackSlots *__range2_1;
  uint32_t offset;
  uint64_t weight;
  uint32_t power;
  uint32_t alignment;
  RAStackSlot *slot;
  iterator __end2;
  iterator __begin2;
  RAStackSlots *__range2;
  uint32_t kBaseRegWeight;
  char *in_stack_000001d0;
  int in_stack_000001dc;
  char *in_stack_000001e0;
  ZoneVector<asmjit::v1_14::RAStackSlot_*> *in_stack_fffffffffffffdd8;
  ZoneVectorBase *this_00;
  ZoneVectorBase *this_01;
  ZoneVectorBase *this_02;
  uint local_1f4;
  RAStackGap local_1e4;
  undefined4 local_1dc;
  uint local_1d8;
  int local_1d4;
  uint local_1d0;
  uint local_1cc;
  int local_1c8;
  uint local_1c4;
  uint32_t local_1c0;
  uint local_1bc;
  int local_1b8;
  byte local_1b1;
  uint local_1b0;
  uint32_t local_1ac;
  RAStackSlot *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  long *local_190;
  ZoneVectorBase local_188 [6];
  ZoneVectorBase local_128;
  undefined4 local_118;
  uint local_114;
  uint local_110;
  uint32_t local_10c;
  RAStackSlot *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  long *local_f0;
  uint local_e4;
  long *local_c8;
  long *local_c0;
  long *local_b8;
  long *local_b0;
  undefined4 *local_a8;
  uint *local_a0;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  uint32_t local_88;
  uint32_t local_84;
  ZoneVectorBase *local_80;
  uint32_t local_70;
  uint local_6c;
  ZoneVectorBase *local_68;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  uint32_t *local_30;
  uint32_t *local_28;
  uint32_t *local_20;
  uint32_t *local_18;
  uint32_t *local_10;
  uint32_t *local_8;
  
  local_e4 = 0x10;
  local_f0 = (long *)(in_RDI + 0x18);
  local_100 = (undefined8 *)(*local_f0 + (ulong)*(uint *)(in_RDI + 0x20) * 8);
  local_c0 = local_f0;
  local_b0 = local_f0;
  local_50 = local_f0;
  local_40 = local_f0;
  for (local_f8 = (undefined8 *)*local_f0; local_f8 != local_100; local_f8 = local_f8 + 1) {
    local_108 = (RAStackSlot *)*local_f8;
    local_10c = RAStackSlot::alignment(local_108);
    if (local_10c == 0) {
      DebugUtils::assertionFailed(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0);
    }
    local_18 = &local_84;
    local_30 = &local_88;
    local_114 = 0;
    for (uVar1 = local_10c; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
      local_114 = local_114 + 1;
    }
    local_118 = 6;
    local_a0 = &local_114;
    local_a8 = &local_118;
    local_1f4 = local_114;
    if (6 < local_114) {
      local_1f4 = 6;
    }
    local_110 = local_1f4;
    local_88 = local_10c;
    local_84 = local_10c;
    bVar2 = RAStackSlot::isRegHome((RAStackSlot *)0x165f4a);
    if (bVar2) {
      uVar5 = (ulong)local_e4;
      uVar3 = RAStackSlot::useCount(local_108);
      local_128._8_8_ = uVar5 + (ulong)uVar3 * (ulong)(7 - local_110);
    }
    else {
      local_128._8_8_ = ZEXT48(local_110);
    }
    if (0xffffffff < (ulong)local_128._8_8_) {
      local_128._size = 0xffffffff;
      local_128._capacity = 0;
    }
    RAStackSlot::setWeight(local_108,local_128._size);
  }
  ZoneVector<asmjit::v1_14::RAStackSlot*>::
  sort<asmjit::v1_14::RAStackAllocator::calculateStackFrame()::__0>
            (in_stack_fffffffffffffdd8,(anon_class_1_0_00000001 *)0x166002);
  local_128._data._0_4_ = 0;
  this_01 = &local_128;
  this_02 = local_188;
  do {
    this_00 = this_02;
    local_80 = this_00;
    ZoneVectorBase::ZoneVectorBase(this_00);
    this_02 = this_00 + 1;
  } while (this_02 != this_01);
  local_190 = (long *)(in_RDI + 0x18);
  local_198 = (undefined8 *)*local_190;
  local_1a0 = (undefined8 *)(*local_190 + (ulong)*(uint *)(in_RDI + 0x20) * 8);
  local_c8 = local_190;
  local_b8 = local_190;
  local_48 = local_190;
  local_38 = local_190;
  do {
    if (local_198 == local_1a0) {
      *(uint *)(in_RDI + 0xc) =
           (uint)local_128._data + *(int *)(in_RDI + 0x10) + -1 &
           (*(int *)(in_RDI + 0x10) - 1U ^ 0xffffffff);
      return 0;
    }
    local_1a8 = (RAStackSlot *)*local_198;
    bVar2 = RAStackSlot::isStackArg((RAStackSlot *)0x166114);
    if (!bVar2) {
      local_1ac = RAStackSlot::alignment(local_1a8);
      local_6c = (uint)local_128._data;
      local_1b0 = (uint)local_128._data + (local_1ac - 1) & (local_1ac - 1 ^ 0xffffffff);
      local_1b1 = 0;
      local_1b8 = 0;
      local_1bc = 0;
      local_70 = local_1ac;
      local_1c0 = RAStackSlot::size(local_1a8);
      if (local_1c0 < 0x40) {
        local_10 = &local_8c;
        local_28 = &local_90;
        local_1c4 = 0;
        for (uVar1 = local_1c0; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
          local_1c4 = local_1c4 + 1;
        }
        do {
          local_68 = local_188 + local_1c4;
          local_90 = local_1c0;
          local_8c = local_1c0;
          if (local_188[local_1c4]._size != 0) {
            ZoneVector<asmjit::v1_14::RAStackGap>::pop
                      ((ZoneVector<asmjit::v1_14::RAStackGap> *)this_01);
            local_54 = local_1cc;
            local_58 = local_1ac;
            if (local_1cc % local_1ac != 0) {
              DebugUtils::assertionFailed(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0);
            }
            RAStackSlot::setOffset(local_1a8,local_1cc);
            local_1b8 = local_1c8 - local_1c0;
            local_1bc = local_1cc - local_1c0;
            local_1b1 = 1;
            break;
          }
          local_1c4 = local_1c4 + 1;
        } while (local_1c4 < 6);
      }
      if (((local_1b1 & 1) == 0) && ((uint)local_128._data != local_1b0)) {
        local_1b8 = local_1b0 - (uint)local_128._data;
        local_1bc = local_1b0;
        local_128._data._0_4_ = local_1b0;
      }
      if (local_1b8 != 0) {
        local_1d0 = local_1b8 + local_1bc;
        for (; local_1bc < local_1d0; local_1bc = local_1d8 + local_1bc) {
          local_94 = local_1bc;
          local_8 = &local_94;
          local_98 = local_1bc;
          local_20 = &local_98;
          local_1d4 = 0;
          for (uVar1 = local_1bc; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
            local_1d4 = local_1d4 + 1;
          }
          local_1d8 = 1 << ((byte)local_1d4 & 0x1f);
          if (local_1d0 - local_1bc < local_1d8) break;
          RAStackGap::RAStackGap(&local_1e4,local_1bc,local_1d8);
          EVar4 = ZoneVector<asmjit::v1_14::RAStackGap>::append
                            ((ZoneVector<asmjit::v1_14::RAStackGap> *)this_02,
                             (ZoneAllocator *)this_01,(RAStackGap *)this_00);
          if (EVar4 != 0) {
            return EVar4;
          }
          local_1dc = 0;
        }
      }
      if ((local_1b1 & 1) == 0) {
        local_5c = (uint)local_128._data;
        local_60 = local_1ac;
        if ((uint)local_128._data % local_1ac != 0) {
          DebugUtils::assertionFailed(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0);
        }
        RAStackSlot::setOffset(local_1a8,(uint)local_128._data);
        uVar3 = RAStackSlot::size(local_1a8);
        local_128._data._0_4_ = uVar3 + (uint)local_128._data;
      }
    }
    local_198 = local_198 + 1;
  } while( true );
}

Assistant:

Error RAStackAllocator::calculateStackFrame() noexcept {
  // Base weight added to all registers regardless of their size and alignment.
  uint32_t kBaseRegWeight = 16;

  // STEP 1:
  //
  // Update usage based on the size of the slot. We boost smaller slots in a way that 32-bit register has a higher
  // priority than a 128-bit register, however, if one 128-bit register is used 4 times more than some other 32-bit
  // register it will overweight it.
  for (RAStackSlot* slot : _slots) {
    uint32_t alignment = slot->alignment();
    ASMJIT_ASSERT(alignment > 0);

    uint32_t power = Support::min<uint32_t>(Support::ctz(alignment), 6);
    uint64_t weight;

    if (slot->isRegHome())
      weight = kBaseRegWeight + (uint64_t(slot->useCount()) * (7 - power));
    else
      weight = power;

    // If overflown, which has less chance of winning a lottery, just use max possible weight. In such case it
    // probably doesn't matter at all.
    if (weight > 0xFFFFFFFFu)
      weight = 0xFFFFFFFFu;

    slot->setWeight(uint32_t(weight));
  }

  // STEP 2:
  //
  // Sort stack slots based on their newly calculated weight (in descending order).
  _slots.sort([](const RAStackSlot* a, const RAStackSlot* b) noexcept {
    return a->weight() >  b->weight() ? 1 :
           a->weight() == b->weight() ? 0 : -1;
  });

  // STEP 3:
  //
  // Calculate offset of each slot. We start from the slot that has the highest weight and advance to slots with
  // lower weight. It could look that offsets start from the first slot in our list and then simply increase, but
  // it's not always the case as we also try to fill all gaps introduced by the fact that slots are sorted by
  // weight and not by size & alignment, so when we need to align some slot we distribute the gap caused by the
  // alignment to `gaps`.
  uint32_t offset = 0;
  ZoneVector<RAStackGap> gaps[kSizeCount - 1];

  for (RAStackSlot* slot : _slots) {
    if (slot->isStackArg())
      continue;

    uint32_t slotAlignment = slot->alignment();
    uint32_t alignedOffset = Support::alignUp(offset, slotAlignment);

    // Try to find a slot within gaps first, before advancing the `offset`.
    bool foundGap = false;
    uint32_t gapSize = 0;
    uint32_t gapOffset = 0;

    {
      uint32_t slotSize = slot->size();
      if (slotSize < (1u << uint32_t(ASMJIT_ARRAY_SIZE(gaps)))) {
        // Iterate from the lowest to the highest possible.
        uint32_t index = Support::ctz(slotSize);
        do {
          if (!gaps[index].empty()) {
            RAStackGap gap = gaps[index].pop();

            ASMJIT_ASSERT(Support::isAligned(gap.offset, slotAlignment));
            slot->setOffset(int32_t(gap.offset));

            gapSize = gap.size - slotSize;
            gapOffset = gap.offset - slotSize;

            foundGap = true;
            break;
          }
        } while (++index < uint32_t(ASMJIT_ARRAY_SIZE(gaps)));
      }
    }

    // No gap found, we may create a new one(s) if the current offset is not aligned.
    if (!foundGap && offset != alignedOffset) {
      gapSize = alignedOffset - offset;
      gapOffset = alignedOffset;

      offset = alignedOffset;
    }

    // True if we have found a gap and not filled all of it or we aligned the current offset.
    if (gapSize) {
      uint32_t gapEnd = gapSize + gapOffset;
      while (gapOffset < gapEnd) {
        uint32_t index = Support::ctz(gapOffset);
        uint32_t slotSize = 1u << index;

        // Weird case, better to bail...
        if (gapEnd - gapOffset < slotSize)
          break;

        ASMJIT_PROPAGATE(gaps[index].append(allocator(), RAStackGap(gapOffset, slotSize)));
        gapOffset += slotSize;
      }
    }

    if (!foundGap) {
      ASMJIT_ASSERT(Support::isAligned(offset, slotAlignment));
      slot->setOffset(int32_t(offset));
      offset += slot->size();
    }
  }

  _stackSize = Support::alignUp(offset, _alignment);
  return kErrorOk;
}